

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O2

void __thiscall
parcel_out_uniform_storage::handle_images
          (parcel_out_uniform_storage *this,glsl_type *base_type,gl_uniform_storage *uniform,
          char *name)

{
  uint uVar1;
  gl_shader_stage gVar2;
  gl_shader_program *pgVar3;
  GLenum GVar4;
  GLenum *pGVar5;
  ulong uVar6;
  ulong uVar7;
  GLenum GVar8;
  bool bVar9;
  
  if (base_type->field_0x4 == '\r') {
    uniform->opaque[this->shader_type].active = true;
    uVar1 = *(uint *)&(this->current_var->data).field_0x4;
    bVar9 = (uVar1 >> 0xb & 1) != 0;
    GVar8 = 35000;
    if (bVar9) {
      GVar8 = 0;
    }
    GVar4 = 0x88ba - bVar9;
    if ((uVar1 >> 10 & 1) != 0) {
      GVar4 = GVar8;
    }
    if (((this->current_var->data).field_0x6 & 4) == 0) {
      bVar9 = set_opaque_indices(this,base_type,uniform,name,&this->next_image,
                                 this->record_next_image);
      if (bVar9) {
        gVar2 = this->shader_type;
        uVar6 = (ulong)uniform->opaque[gVar2].index;
        uVar7 = 0x20;
        if (this->next_image < 0x20) {
          uVar7 = (ulong)this->next_image;
        }
        pgVar3 = this->prog;
        for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
          (pgVar3->_LinkedShaders[gVar2]->Program->field_20).sh.ImageAccess[uVar6] = (GLenum16)GVar4
          ;
        }
      }
    }
    else {
      bVar9 = set_opaque_indices(this,base_type,uniform,name,&this->next_bindless_image,
                                 this->record_next_bindless_image);
      if (bVar9) {
        this->num_bindless_images = this->next_bindless_image;
        pGVar5 = (GLenum *)realloc(this->bindless_access,(ulong)this->next_bindless_image << 2);
        this->bindless_access = pGVar5;
        uVar1 = this->num_bindless_images;
        for (uVar6 = (ulong)uniform->opaque[this->shader_type].index; uVar6 < uVar1;
            uVar6 = uVar6 + 1) {
          pGVar5[uVar6] = GVar4;
        }
      }
    }
  }
  return;
}

Assistant:

bool is_image() const
   {
      return base_type == GLSL_TYPE_IMAGE;
   }